

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O0

ShaderCodeBufferDescX *
Diligent::PrepareUBReflection
          (ShaderCodeBufferDescX *__return_storage_ptr__,
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          *Vars,Uint32 Size)

{
  undefined8 __end;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  reference this;
  char *pcVar5;
  uint *puVar6;
  Char *pCVar7;
  size_t idx;
  ShaderCodeVariableDescX *pSVar8;
  uint local_274;
  anon_class_8_1_90feeb22 aStack_270;
  Uint32 i;
  undefined1 local_261;
  int local_260;
  uint local_25c;
  string local_258;
  undefined1 local_238 [8];
  string msg_1;
  ShaderCodeVariableDescX *pArray;
  string local_200;
  int local_1dc;
  undefined1 local_1d8 [4];
  int ArrayInd;
  string NameWithoutBrackets;
  size_t Idx;
  ShaderCodeVariableDesc StructVarDesc;
  string msg;
  ShaderCodeVariableDescX *pVar;
  undefined1 local_148 [4];
  int ArrayInd_1;
  string NameWithoutBrackets_1;
  allocator<char> local_111;
  undefined1 local_110 [8];
  string Prefix;
  char *Dot;
  char *Name;
  ShaderCodeVariableDescX *pLevel;
  ShaderCodeVariableDescX *Var;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  *__range1;
  ShaderCodeVariableDescX GlobalVars;
  Uint32 Size_local;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  *Vars_local;
  ShaderCodeBufferDescX *BuffDesc;
  
  iVar3 = std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::begin(Vars);
  iVar4 = std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::end(Vars);
  std::
  sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>
            (iVar3._M_current,iVar4._M_current);
  ShaderCodeVariableDescX::ShaderCodeVariableDescX((ShaderCodeVariableDescX *)&__range1);
  __end1 = std::
           vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ::begin(Vars);
  Var = (ShaderCodeVariableDescX *)
        std::
        vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
        ::end(Vars);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::ShaderCodeVariableDescX_*,_std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>
                                     *)&Var), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<Diligent::ShaderCodeVariableDescX_*,_std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>
           ::operator*(&__end1);
    Name = (char *)&__range1;
    Dot = (this->super_ShaderCodeVariableDesc).Name;
    Prefix.field_2._8_8_ = strchr(Dot,0x2e);
    while (__end = Prefix.field_2._8_8_, Prefix.field_2._8_8_ != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((string *)local_110,Dot,(char *)__end,&local_111);
      std::allocator<char>::~allocator(&local_111);
      std::__cxx11::string::string((string *)local_148);
      iVar2 = Parsing::GetArrayIndex((string *)local_110,(string *)local_148);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pSVar8 = ShaderCodeVariableDescX::FindMember((ShaderCodeVariableDescX *)Name,pcVar5);
      if (pSVar8 == (ShaderCodeVariableDescX *)0x0) {
        ShaderCodeVariableDesc::ShaderCodeVariableDesc((ShaderCodeVariableDesc *)&Idx);
        Idx = std::__cxx11::string::c_str();
        StructVarDesc.TypeName._0_1_ = 5;
        StructVarDesc.TypeName._4_4_ = (this->super_ShaderCodeVariableDesc).Offset;
        idx = ShaderCodeVariableDescX::AddMember
                        ((ShaderCodeVariableDescX *)Name,(ShaderCodeVariableDesc *)&Idx);
        Name = (char *)ShaderCodeVariableDescX::GetMember((ShaderCodeVariableDescX *)Name,idx);
        NameWithoutBrackets.field_2._8_4_ = iVar2 + 1;
        NameWithoutBrackets.field_2._12_4_ =
             StaticCast<unsigned_int,int>((int *)(NameWithoutBrackets.field_2._M_local_buf + 8));
        puVar6 = std::max<unsigned_int>
                           (&(((ShaderCodeVariableDescX *)Name)->super_ShaderCodeVariableDesc).
                             ArraySize,(uint *)(NameWithoutBrackets.field_2._M_local_buf + 0xc));
        (((ShaderCodeVariableDescX *)Name)->super_ShaderCodeVariableDesc).ArraySize = *puVar6;
      }
      else {
        msg.field_2._8_4_ = iVar2 + 1;
        msg.field_2._12_4_ = StaticCast<unsigned_int,int>((int *)(msg.field_2._M_local_buf + 8));
        puVar6 = std::max<unsigned_int>
                           (&(pSVar8->super_ShaderCodeVariableDesc).ArraySize,
                            (uint *)(msg.field_2._M_local_buf + 0xc));
        (pSVar8->super_ShaderCodeVariableDesc).ArraySize = *puVar6;
        Name = (char *)pSVar8;
        if ((this->super_ShaderCodeVariableDesc).Offset <
            (pSVar8->super_ShaderCodeVariableDesc).Offset) {
          FormatString<char[26],char[27]>
                    ((string *)&StructVarDesc.pMembers,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Var.Offset >= pVar->Offset",(char (*) [27])pSVar8);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"PrepareUBReflection",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x170);
          std::__cxx11::string::~string((string *)&StructVarDesc.pMembers);
        }
      }
      Dot = (char *)(Prefix.field_2._8_8_ + 1);
      Prefix.field_2._8_8_ = strchr(Dot,0x2e);
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)local_110);
    }
    std::__cxx11::string::string((string *)local_1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,Dot,(allocator *)((long)&pArray + 7));
    iVar2 = Parsing::GetArrayIndex(&local_200,(string *)local_1d8);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pArray + 7));
    local_1dc = iVar2;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pSVar8 = ShaderCodeVariableDescX::FindMember((ShaderCodeVariableDescX *)Name,pcVar5);
    if (pSVar8 == (ShaderCodeVariableDescX *)0x0) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1d8,(this->super_ShaderCodeVariableDesc).Name);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_258,(string *)local_1d8);
        ShaderCodeVariableDescX::SetName(this,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
      }
      local_260 = local_1dc + 1;
      local_25c = StaticCast<unsigned_int,int>(&local_260);
      puVar6 = std::max<unsigned_int>(&(this->super_ShaderCodeVariableDesc).ArraySize,&local_25c);
      (this->super_ShaderCodeVariableDesc).ArraySize = *puVar6;
      ShaderCodeVariableDescX::AddMember((ShaderCodeVariableDescX *)Name,this);
    }
    else {
      msg_1.field_2._8_4_ = local_1dc + 1;
      msg_1.field_2._12_4_ = StaticCast<unsigned_int,int>((int *)(msg_1.field_2._M_local_buf + 8));
      puVar6 = std::max<unsigned_int>
                         (&(pSVar8->super_ShaderCodeVariableDesc).ArraySize,
                          (uint *)(msg_1.field_2._M_local_buf + 0xc));
      (pSVar8->super_ShaderCodeVariableDesc).ArraySize = *puVar6;
      if ((this->super_ShaderCodeVariableDesc).Offset <
          (pSVar8->super_ShaderCodeVariableDesc).Offset) {
        FormatString<char[26],char[29]>
                  ((string *)local_238,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Var.Offset >= pArray->Offset",(char (*) [29])pSVar8);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"PrepareUBReflection",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x19e);
        std::__cxx11::string::~string((string *)local_238);
      }
    }
    std::__cxx11::string::~string((string *)local_1d8);
    __gnu_cxx::
    __normal_iterator<Diligent::ShaderCodeVariableDescX_*,_std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>
    ::operator++(&__end1);
  }
  local_261 = 0;
  ShaderCodeBufferDescX::ShaderCodeBufferDescX(__return_storage_ptr__);
  (__return_storage_ptr__->super_ShaderCodeBufferDesc).Size = Size;
  aStack_270.BuffDesc = __return_storage_ptr__;
  ShaderCodeVariableDescX::
  ProcessMembers<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__1>
            ((ShaderCodeVariableDescX *)&__range1,&stack0xfffffffffffffd90);
  for (local_274 = 0; local_274 < (__return_storage_ptr__->super_ShaderCodeBufferDesc).NumVariables;
      local_274 = local_274 + 1) {
    pSVar8 = ShaderCodeBufferDescX::GetVariable(__return_storage_ptr__,(ulong)local_274);
    ProcessUBVariable(pSVar8,0);
  }
  local_261 = 1;
  ShaderCodeVariableDescX::~ShaderCodeVariableDescX((ShaderCodeVariableDescX *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

static ShaderCodeBufferDescX PrepareUBReflection(std::vector<ShaderCodeVariableDescX>&& Vars, Uint32 Size)
{
    // Sort variables by offset - they are reflected in some arbitrary order
    std::sort(Vars.begin(), Vars.end(),
              [](const ShaderCodeVariableDescX& Var1, const ShaderCodeVariableDescX& Var2) {
                  return Var1.Offset < Var2.Offset;
              });

    // Proxy variable for global variables in the block
    ShaderCodeVariableDescX GlobalVars;
    for (auto& Var : Vars)
    {
        auto* pLevel = &GlobalVars;

        const auto* Name = Var.Name;
        const auto* Dot  = strchr(Name, '.');
        while (Dot != nullptr)
        {
            // s2[1].s1.f4[2]
            //      ^
            //     Dot
            std::string Prefix{Name, Dot}; // "s2[1]"
            std::string NameWithoutBrackets;
            const auto  ArrayInd = Parsing::GetArrayIndex(Prefix, NameWithoutBrackets);
            // ArrayInd = 1
            // NameWithoutBrackets = "s2"

            // Search for the variable with the same name
            if (auto* pVar = pLevel->FindMember(NameWithoutBrackets.c_str()))
            {
                // Variable already exists - we are processing an element of an existing array or struct:
                //
                // Existing struct:
                //
                //      Level         Offset
                //     0  1  2
                //
                //    s2.s1.f4          16
                //    s2.s1.u4          32
                //    s2.f4             48
                //
                //
                // Existing array:
                //
                //      Level         Offset
                //    0    1   2
                //
                //  s2[0].s1.f4[0]      16      Note that s2[0].s1.f4[1] is not enumerated
                //  s2[0].s1.u4         48
                //  s2[0].f4            64
                //  s2[1].s1.f4[0]      80
                //  s2[1].s1.u4        112
                //  s2[1].f4           128

                // Update the array size.
                pVar->ArraySize = std::max(pVar->ArraySize, StaticCast<Uint32>(ArrayInd + 1));
                // The struct offset is the minimal offset of its members,
                // which should always be the first variable in the list.
                VERIFY_EXPR(Var.Offset >= pVar->Offset);
                pLevel = pVar;
            }
            else
            {
                // Add a new structure variable.
                ShaderCodeVariableDesc StructVarDesc;
                StructVarDesc.Name   = NameWithoutBrackets.c_str();
                StructVarDesc.Class  = SHADER_CODE_VARIABLE_CLASS_STRUCT;
                StructVarDesc.Offset = Var.Offset;

                auto Idx          = pLevel->AddMember(StructVarDesc);
                pLevel            = &pLevel->GetMember(Idx);
                pLevel->ArraySize = std::max(pLevel->ArraySize, StaticCast<Uint32>(ArrayInd + 1));
            }

            // s2[1].s1.f4[2]
            //      ^
            //     Dot

            Name = Dot + 1;
            // s2[1].s1.f4[2]
            //       ^
            //      Name

            Dot = strchr(Name, '.');
            // s2[1].s1.f4[2]
            //         ^
            //        Dot
        }

        // s2[1].s1.f4[2]
        //          ^
        //         Name

        std::string NameWithoutBrackets;
        const auto  ArrayInd = Parsing::GetArrayIndex(Name, NameWithoutBrackets);
        // ArrayInd = 2
        // NameWithoutBrackets = "f4"
        if (auto* pArray = pLevel->FindMember(NameWithoutBrackets.c_str()))
        {
            // Array already exists
            // s2[0].s1.f4[0]
            // s2[1].s1.f4[0]
            //          ^
            pArray->ArraySize = std::max(pArray->ArraySize, StaticCast<Uint32>(ArrayInd + 1));
            VERIFY_EXPR(Var.Offset >= pArray->Offset);
        }
        else
        {
            if (NameWithoutBrackets != Var.Name)
                Var.SetName(NameWithoutBrackets);

            // Note that individual members of innermost arrays are not enumrated, e.g. for
            // the following struct
            //
            //  struct S2
            //  {
            //      struct S1
            //      {
            //          vec4 f4[2]
            //      }s1;
            //  }s2;
            //
            // only a single uniform is enumerated: s2.s1.f4[0]. The array size will be
            // determined by AddUniformBufferVariable() from the value of GL_UNIFORM_SIZE parameter.
            Var.ArraySize = std::max(Var.ArraySize, StaticCast<Uint32>(ArrayInd + 1));
            pLevel->AddMember(std::move(Var));
        }
    }

    ShaderCodeBufferDescX BuffDesc;
    BuffDesc.Size = Size;

    GlobalVars.ProcessMembers(
        [&BuffDesc](auto& Members) {
            BuffDesc.AssignVariables(std::move(Members));
        });

    for (Uint32 i = 0; i < BuffDesc.NumVariables; ++i)
        ProcessUBVariable(BuffDesc.GetVariable(i), 0);

    return BuffDesc;
}